

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeCompiler.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_astDoWhileContinueWithNode_primitiveCompileIntoBytecode
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t *psVar1;
  sysbvm_tuple_t sVar2;
  sysbvm_tuple_t destination;
  sysbvm_tuple_t breakLabel;
  sysbvm_tuple_t condition;
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_40_5_ce5bb3dd gcFrame;
  sysbvm_astDoWhileContinueWithNode_t **doWhileNode;
  sysbvm_functionBytecodeDirectCompiler_t **compiler;
  sysbvm_tuple_t *node;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  psVar1 = arguments + 1;
  memset(&gcFrameRecord.roots,0,0x28);
  memset(&condition,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_CONTINUE_TARGET;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&condition);
  gcFrameRecord.roots =
       (sysbvm_tuple_t *)sysbvm_functionBytecodeAssemblerInstruction_createLabel(context);
  sVar2 = sysbvm_functionBytecodeAssemblerInstruction_createLabel(context);
  destination = sysbvm_functionBytecodeAssemblerInstruction_createLabel(context);
  breakLabel = sysbvm_functionBytecodeAssemblerInstruction_createLabel(context);
  sysbvm_functionBytecodeAssembler_addInstruction
            (*(sysbvm_functionBytecodeAssembler_t **)(*psVar1 + 0x10),
             (sysbvm_tuple_t)gcFrameRecord.roots);
  if (*(long *)(*arguments + 0x28) != 0) {
    sysbvm_functionBytecodeDirectCompiler_compileASTNodeWithBreakAndContinue
              (context,(sysbvm_functionBytecodeDirectCompiler_t *)*psVar1,
               *(sysbvm_tuple_t *)(*arguments + 0x28),breakLabel,sVar2);
  }
  sysbvm_functionBytecodeAssembler_jump
            (context,*(sysbvm_functionBytecodeAssembler_t **)(*psVar1 + 0x10),sVar2);
  sysbvm_functionBytecodeAssembler_addInstruction
            (*(sysbvm_functionBytecodeAssembler_t **)(*psVar1 + 0x10),sVar2);
  if (*(long *)(*arguments + 0x30) == 0) {
    sysbvm_functionBytecodeAssembler_jump
              (context,*(sysbvm_functionBytecodeAssembler_t **)(*psVar1 + 0x10),destination);
  }
  else {
    sVar2 = sysbvm_functionBytecodeDirectCompiler_compileASTNode
                      (context,(sysbvm_functionBytecodeDirectCompiler_t *)*psVar1,
                       *(sysbvm_tuple_t *)(*arguments + 0x30));
    sysbvm_functionBytecodeAssembler_jumpIfFalse
              (context,*(sysbvm_functionBytecodeAssembler_t **)(*psVar1 + 0x10),sVar2,breakLabel);
  }
  sysbvm_functionBytecodeAssembler_addInstruction
            (*(sysbvm_functionBytecodeAssembler_t **)(*psVar1 + 0x10),destination);
  if (*(long *)(*arguments + 0x38) != 0) {
    sysbvm_functionBytecodeDirectCompiler_compileASTNode
              (context,(sysbvm_functionBytecodeDirectCompiler_t *)*psVar1,
               *(sysbvm_tuple_t *)(*arguments + 0x38));
  }
  sysbvm_functionBytecodeAssembler_jump
            (context,*(sysbvm_functionBytecodeAssembler_t **)(*psVar1 + 0x10),
             (sysbvm_tuple_t)gcFrameRecord.roots);
  sysbvm_functionBytecodeAssembler_addInstruction
            (*(sysbvm_functionBytecodeAssembler_t **)(*psVar1 + 0x10),breakLabel);
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&condition);
  sVar2 = sysbvm_functionBytecodeAssembler_addLiteral
                    (context,*(sysbvm_functionBytecodeAssembler_t **)(*psVar1 + 0x10),0x2f);
  return sVar2;
}

Assistant:

static sysbvm_tuple_t sysbvm_astDoWhileContinueWithNode_primitiveCompileIntoBytecode(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_functionBytecodeDirectCompiler_t **compiler = (sysbvm_functionBytecodeDirectCompiler_t **)&arguments[1];

    sysbvm_astDoWhileContinueWithNode_t **doWhileNode = (sysbvm_astDoWhileContinueWithNode_t**)node;
    struct {
        sysbvm_tuple_t doWhileEntryLabel;
        sysbvm_tuple_t doWhileCondition;
        sysbvm_tuple_t doWhileContinue;
        sysbvm_tuple_t doWhileMergeLabel;
        sysbvm_tuple_t result;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    gcFrame.doWhileEntryLabel = sysbvm_functionBytecodeAssemblerInstruction_createLabel(context);
    gcFrame.doWhileCondition = sysbvm_functionBytecodeAssemblerInstruction_createLabel(context);
    gcFrame.doWhileContinue = sysbvm_functionBytecodeAssemblerInstruction_createLabel(context);
    gcFrame.doWhileMergeLabel = sysbvm_functionBytecodeAssemblerInstruction_createLabel(context);

    // Do while body.
    sysbvm_functionBytecodeAssembler_addInstruction((*compiler)->assembler, gcFrame.doWhileEntryLabel);
    if((*doWhileNode)->bodyExpression)
        sysbvm_functionBytecodeDirectCompiler_compileASTNodeWithBreakAndContinue(context, *compiler, (*doWhileNode)->bodyExpression, gcFrame.doWhileMergeLabel, gcFrame.doWhileCondition);
    sysbvm_functionBytecodeAssembler_jump(context, (*compiler)->assembler, gcFrame.doWhileCondition);

    // Do while condition block.
    sysbvm_functionBytecodeAssembler_addInstruction((*compiler)->assembler, gcFrame.doWhileCondition);
    if((*doWhileNode)->conditionExpression)
    {
        sysbvm_tuple_t condition = sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, *compiler, (*doWhileNode)->conditionExpression);
        sysbvm_functionBytecodeAssembler_jumpIfFalse(context, (*compiler)->assembler, condition, gcFrame.doWhileMergeLabel);
    }
    else
    {
        sysbvm_functionBytecodeAssembler_jump(context, (*compiler)->assembler, gcFrame.doWhileContinue);
    }

    // Do while continue
    sysbvm_functionBytecodeAssembler_addInstruction((*compiler)->assembler, gcFrame.doWhileContinue);
    if((*doWhileNode)->continueExpression)
        sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, *compiler, (*doWhileNode)->continueExpression);

    sysbvm_functionBytecodeAssembler_jump(context, (*compiler)->assembler, gcFrame.doWhileEntryLabel);

    // While merge
    sysbvm_functionBytecodeAssembler_addInstruction((*compiler)->assembler, gcFrame.doWhileMergeLabel);

    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return sysbvm_functionBytecodeAssembler_addLiteral(context, (*compiler)->assembler, SYSBVM_VOID_TUPLE);
}